

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

uint32_t __thiscall
spirv_cross::CompilerMSL::build_msl_interpolant_type
          (CompilerMSL *this,uint32_t type_id,bool is_noperspective)

{
  ID id;
  SPIRType *pSVar1;
  undefined7 in_register_00000011;
  
  id.id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
  pSVar1 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + type_id);
  pSVar1 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                     ((Compiler *)this,id.id,pSVar1);
  pSVar1->basetype = Interpolant;
  (pSVar1->parent_type).id = type_id;
  if ((int)CONCAT71(in_register_00000011,is_noperspective) != 0) {
    Compiler::set_decoration((Compiler *)this,id,DecorationNoPerspective,0);
  }
  return id.id;
}

Assistant:

uint32_t CompilerMSL::build_msl_interpolant_type(uint32_t type_id, bool is_noperspective)
{
	uint32_t new_type_id = ir.increase_bound_by(1);
	SPIRType &type = set<SPIRType>(new_type_id, get<SPIRType>(type_id));
	type.basetype = SPIRType::Interpolant;
	type.parent_type = type_id;
	// In Metal, the pull-model interpolant type encodes perspective-vs-no-perspective in the type itself.
	// Add this decoration so we know which argument to pass to the template.
	if (is_noperspective)
		set_decoration(new_type_id, DecorationNoPerspective);
	return new_type_id;
}